

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  uint extraout_EAX;
  ulong uVar1;
  ucvector PLTE;
  ucvector local_38;
  
  local_38.data = (uchar *)0x0;
  local_38.size = 0;
  local_38.allocsize = 0;
  for (uVar1 = 0; uVar1 < info->palettesize << 2; uVar1 = uVar1 + 1) {
    if ((~(uint)uVar1 & 3) != 0) {
      ucvector_push_back(&local_38,info->palette[uVar1]);
    }
  }
  addChunk(out,"PLTE",local_38.data,local_38.size);
  ucvector_cleanup(&local_38);
  return extraout_EAX;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector PLTE;
  ucvector_init(&PLTE);
  for(i = 0; i < info->palettesize * 4; i++)
  {
    /*add all channels except alpha channel*/
    if(i % 4 != 3) ucvector_push_back(&PLTE, info->palette[i]);
  }
  error = addChunk(out, "PLTE", PLTE.data, PLTE.size);
  ucvector_cleanup(&PLTE);

  return error;
}